

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall xmrig::Miner::onRequest(Miner *this,IApiRequest *request)

{
  MinerPrivate *pMVar1;
  pointer ppIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  pointer ppIVar7;
  
  iVar4 = (*request->_vptr_IApiRequest[0xb])(request);
  iVar5 = (*request->_vptr_IApiRequest[0xe])(request);
  if (iVar4 == 1) {
    if (iVar5 == 1) {
      (*request->_vptr_IApiRequest[2])();
      pMVar1 = this->d_ptr;
      iVar4 = (*request->_vptr_IApiRequest[0xd])(request);
      iVar5 = (*request->_vptr_IApiRequest[0xc])(request);
      iVar6 = (*request->_vptr_IApiRequest[10])(request);
      MinerPrivate::getMiner
                (pMVar1,(Value *)CONCAT44(extraout_var,iVar4),
                 (Document *)CONCAT44(extraout_var_00,iVar5),iVar6);
      pMVar1 = this->d_ptr;
      iVar4 = (*request->_vptr_IApiRequest[0xd])(request);
      iVar5 = (*request->_vptr_IApiRequest[0xc])(request);
      iVar6 = (*request->_vptr_IApiRequest[10])(request);
      MinerPrivate::getHashrate
                (pMVar1,(Value *)CONCAT44(extraout_var_01,iVar4),
                 (Document *)CONCAT44(extraout_var_02,iVar5),iVar6);
    }
    else {
      iVar4 = (*request->_vptr_IApiRequest[9])(request);
      bVar3 = String::isEqual((String *)CONCAT44(extraout_var_04,iVar4),"/2/backends");
      if (bVar3) {
        (*request->_vptr_IApiRequest[2])(request);
        pMVar1 = this->d_ptr;
        iVar4 = (*request->_vptr_IApiRequest[0xd])(request);
        iVar5 = (*request->_vptr_IApiRequest[0xc])(request);
        MinerPrivate::getBackends
                  (pMVar1,(Value *)CONCAT44(extraout_var_05,iVar4),
                   (Document *)CONCAT44(extraout_var_06,iVar5));
      }
    }
  }
  else if (iVar5 == 2) {
    iVar4 = (*request->_vptr_IApiRequest[8])(request);
    bVar3 = String::isEqual((String *)CONCAT44(extraout_var_03,iVar4),"pause");
    if (bVar3) {
      (*request->_vptr_IApiRequest[2])();
      bVar3 = false;
    }
    else {
      iVar4 = (*request->_vptr_IApiRequest[8])(request);
      bVar3 = String::isEqual((String *)CONCAT44(extraout_var_07,iVar4),"resume");
      if (!bVar3) {
        iVar4 = (*request->_vptr_IApiRequest[8])(request);
        bVar3 = String::isEqual((String *)CONCAT44(extraout_var_08,iVar4),"stop");
        if (bVar3) {
          (*request->_vptr_IApiRequest[2])(request);
          stop(this);
        }
        goto LAB_001793fa;
      }
      (*request->_vptr_IApiRequest[2])();
      bVar3 = true;
    }
    setEnabled(this,bVar3);
  }
LAB_001793fa:
  ppIVar2 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar7 = (this->d_ptr->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1) {
    (*(*ppIVar7)->_vptr_IBackend[0xe])(*ppIVar7,request);
  }
  return;
}

Assistant:

void xmrig::Miner::onRequest(IApiRequest &request)
{
    if (request.method() == IApiRequest::METHOD_GET) {
        if (request.type() == IApiRequest::REQ_SUMMARY) {
            request.accept();

            d_ptr->getMiner(request.reply(), request.doc(), request.version());
            d_ptr->getHashrate(request.reply(), request.doc(), request.version());
        }
        else if (request.url() == "/2/backends") {
            request.accept();

            d_ptr->getBackends(request.reply(), request.doc());
        }
    }
    else if (request.type() == IApiRequest::REQ_JSON_RPC) {
        if (request.rpcMethod() == "pause") {
            request.accept();

            setEnabled(false);
        }
        else if (request.rpcMethod() == "resume") {
            request.accept();

            setEnabled(true);
        }
        else if (request.rpcMethod() == "stop") {
            request.accept();

            stop();
        }
    }

    for (IBackend *backend : d_ptr->backends) {
        backend->handleRequest(request);
    }
}